

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::BrokerApp::generateParser(BrokerApp *this,bool noTypeOption)

{
  bool bVar1;
  pointer phVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  helicsCLI11App *in_RDI;
  string *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  string *in_stack_00000028;
  App *in_stack_00000030;
  helicsCLI11App *app_p;
  __single_object *app;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff20;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> __s;
  anon_class_8_1_a7a570f2 local_a0 [4];
  pointer local_80;
  allocator<char> local_71 [9];
  char (*in_stack_ffffffffffffff98) [19];
  allocator<char> local_49 [55];
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  __s._M_head_impl = in_RDI;
  std::make_unique<helics::helicsCLI11App,char_const(&)[19]>(in_stack_ffffffffffffff98);
  if ((local_11 & 1) == 0) {
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x41e1c4);
    helicsCLI11App::addTypeOption((helicsCLI11App *)app,this._7_1_);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x41e1fc);
  if (bVar1) {
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x41e20f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)__s._M_head_impl,(allocator<char> *)in_RDI);
    in_stack_ffffffffffffff20 =
         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *)&in_RSI->field_2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)__s._M_head_impl,(allocator<char> *)in_RDI);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_71);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_49);
  }
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x41e356);
  CLI::App::allow_extras(&phVar2->super_App,true);
  local_80 = CLI::std::
             unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
                       ((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                         *)in_stack_ffffffffffffff10);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x41e37e);
  std::function<std::__cxx11::string()>::function<helics::BrokerApp::generateParser(bool)::__0,void>
            (in_stack_ffffffffffffff20,local_a0);
  CLI::App::footer(&phVar2->super_App,in_stack_ffffffffffffff08);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x41e3bc);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)
           __s._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> BrokerApp::generateParser(bool noTypeOption)
{
    auto app = std::make_unique<helicsCLI11App>("Broker application");
    if (!noTypeOption) {
        app->addTypeOption();
    }

    if (name.empty()) {
        app->add_option("--name,-n", name, "name of the broker");
    }
    app->allow_extras();
    auto* app_p = app.get();
    app->footer([app_p]() {
        auto coreType = coreTypeFromString((*app_p)["--coretype"]->as<std::string>());
        BrokerFactory::displayHelp(coreType);
        return std::string();
    });
    return app;
}